

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

void __thiscall Mat::Mat(Mat *this,Mat *A,Mat *B)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  lVar4 = (long)B->n_rows_ + (long)A->n_rows_;
  iVar3 = (int)lVar4;
  this->n_rows_ = iVar3;
  this->n_cols_ = A->n_cols_;
  uVar6 = 0xffffffffffffffff;
  if (-1 < iVar3) {
    uVar6 = lVar4 * 8;
  }
  pdVar2 = (double *)operator_new__(uVar6);
  this->v_ = pdVar2;
  iVar3 = A->n_rows_;
  if (0 < (long)iVar3) {
    pdVar1 = A->v_;
    lVar4 = 0;
    do {
      pdVar2[lVar4] = pdVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (iVar3 != lVar4);
  }
  lVar4 = (long)B->n_rows_;
  if (0 < lVar4) {
    pdVar1 = B->v_;
    lVar5 = 0;
    do {
      pdVar2[lVar4 + lVar5] = pdVar1[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return;
}

Assistant:

Mat::Mat(const Mat &A, const Mat &B)
{
	n_rows_ = A.n_rows_ + B.n_rows_;
	n_cols_ = A.n_cols_;
	v_ = new double [n_rows_];
	int i;
	for (i=0; i<A.n_rows_; i++)
		v_[i]=A.v_[i];
	for (i=0; i<B.n_rows_; i++)
		(*this)(i+B.n_rows_)=B.v_[i];
}